

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

int archive_write_zip_header(archive_write *a,archive_entry *entry)

{
  long lVar1;
  uchar uVar2;
  short sVar3;
  wchar_t wVar4;
  undefined4 uVar5;
  int iVar6;
  uint uVar7;
  mode_t mVar8;
  wchar_t wVar9;
  la_int64_t lVar10;
  archive_entry *paVar11;
  int *piVar12;
  char *pcVar13;
  char *pcVar14;
  time_t tVar15;
  uchar *puVar16;
  uchar *pp;
  byte bVar17;
  byte bVar18;
  short sVar19;
  short sVar20;
  int included;
  uchar *external_info;
  uchar *zip64_start;
  int64_t additional_size;
  int64_t size;
  size_t len;
  char *p;
  int version_needed;
  mode_t type;
  int ret2;
  int ret;
  archive_string_conv *sconv;
  size_t slink_size;
  char *slink;
  size_t filename_length;
  uchar *cd_extra;
  uchar *e;
  zip_conflict *zip;
  uchar local_extra [144];
  uchar local_header [32];
  archive_entry *entry_local;
  archive_write *a_local;
  
  e = (uchar *)a->format_data;
  slink_size = 0;
  sconv = (archive_string_conv *)0x0;
  _ret2 = get_sconv(a,(zip_conflict *)e);
  version_needed = 0;
  p._0_4_ = 10;
  p._4_4_ = archive_entry_filetype(entry);
  if (((p._4_4_ != 0x8000) && (p._4_4_ != 0x4000)) && (p._4_4_ != 0xa000)) {
    archive_set_error(&a->archive,-1,"Filetype not supported");
    return -0x19;
  }
  if ((*(uint *)(e + 0x138) & 1) != 0) {
    wVar4 = archive_entry_size_is_set(entry);
    if ((wVar4 != L'\0') && (lVar10 = archive_entry_size(entry), 0xffffffff < lVar10)) {
      archive_set_error(&a->archive,-1,"Files > 4GB require Zip64 extensions");
      return -0x19;
    }
    if (0xffffffff < *(long *)(e + 0x110)) {
      archive_set_error(&a->archive,-1,"Archives > 4GB require Zip64 extensions");
      return -0x19;
    }
  }
  if (p._4_4_ != 0x8000) {
    archive_entry_set_size(entry,0);
  }
  *(undefined8 *)e = *(undefined8 *)(e + 0x110);
  e[0x28] = 0xff;
  e[0x29] = 0xff;
  e[0x2a] = 0xff;
  e[0x2b] = 0xff;
  e[0x2c] = 0xff;
  e[0x2d] = 0xff;
  e[0x2e] = 0xff;
  e[0x2f] = '\x7f';
  e[8] = '\0';
  e[9] = '\0';
  e[10] = '\0';
  e[0xb] = '\0';
  e[0xc] = '\0';
  e[0xd] = '\0';
  e[0xe] = '\0';
  e[0xf] = '\0';
  e[0x10] = '\0';
  e[0x11] = '\0';
  e[0x12] = '\0';
  e[0x13] = '\0';
  e[0x14] = '\0';
  e[0x15] = '\0';
  e[0x16] = '\0';
  e[0x17] = '\0';
  e[0x18] = '\0';
  e[0x19] = '\0';
  e[0x1a] = '\0';
  e[0x1b] = '\0';
  e[0x1c] = '\0';
  e[0x1d] = '\0';
  e[0x1e] = '\0';
  e[0x1f] = '\0';
  e[0x20] = '\0';
  e[0x21] = '\0';
  e[0x22] = '\0';
  e[0x23] = '\0';
  e[0x24] = '\0';
  e[0x25] = '\0';
  e[0x26] = '\0';
  e[0x27] = '\0';
  e[0x44] = '\0';
  e[0x45] = '\0';
  e[0x46] = '\0';
  e[0x47] = '\0';
  e[0x48] = '\0';
  e[0x49] = '\0';
  e[0x4a] = '\0';
  e[0x4b] = '\0';
  uVar5 = (**(code **)(e + 0xe8))(0);
  *(undefined4 *)(e + 0x38) = uVar5;
  e[0x40] = '\0';
  e[0x41] = '\0';
  e[0x42] = '\0';
  e[0x43] = '\0';
  if (*(long *)(e + 0x30) != 0) {
    archive_entry_free(*(archive_entry **)(e + 0x30));
    e[0x30] = '\0';
    e[0x31] = '\0';
    e[0x32] = '\0';
    e[0x33] = '\0';
    e[0x34] = '\0';
    e[0x35] = '\0';
    e[0x36] = '\0';
    e[0x37] = '\0';
  }
  if (e[0xc0] != '\0') {
    aes_ctr_release((archive_crypto_ctx *)(e + 0x68));
  }
  if (e[0xd0] != '\0') {
    __hmac_sha1_cleanup((archive_hmac_sha1_ctx *)(e + 200));
  }
  e[0xd0] = '\0';
  e[0xc0] = '\0';
  e[0x5c] = '\0';
  if (((p._4_4_ == 0x8000) &&
      ((wVar4 = archive_entry_size_is_set(entry), wVar4 == L'\0' ||
       (lVar10 = archive_entry_size(entry), 0 < lVar10)))) && (*(int *)(e + 0x134) - 1U < 3)) {
    *(uint *)(e + 0x44) = *(uint *)(e + 0x44) | 1;
    *(undefined4 *)(e + 0x40) = *(undefined4 *)(e + 0x134);
  }
  paVar11 = archive_entry_clone(entry);
  *(archive_entry **)(e + 0x30) = paVar11;
  if (*(long *)(e + 0x30) == 0) {
    archive_set_error(&a->archive,0xc,"Can\'t allocate zip header data");
    a_local._4_4_ = -0x1e;
  }
  else {
    if (_ret2 != (archive_string_conv *)0x0) {
      wVar4 = _archive_entry_pathname_l(entry,(char **)&len,(size_t *)&size,_ret2);
      if (wVar4 != L'\0') {
        piVar12 = __errno_location();
        if (*piVar12 == 0xc) {
          archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Pathname");
          return -0x1e;
        }
        pcVar13 = archive_entry_pathname(entry);
        pcVar14 = archive_string_conversion_charset_name(_ret2);
        archive_set_error(&a->archive,0x54,"Can\'t translate Pathname \'%s\' to %s",pcVar13,pcVar14)
        ;
        version_needed = -0x14;
      }
      if (size != 0) {
        archive_entry_set_pathname(*(archive_entry **)(e + 0x30),(char *)len);
      }
      if (p._4_4_ == 0xa000) {
        wVar4 = _archive_entry_symlink_l(entry,(char **)&len,(size_t *)&size,_ret2);
        if (wVar4 == L'\0') {
          if (size != 0) {
            archive_entry_set_symlink(*(archive_entry **)(e + 0x30),(char *)len);
          }
        }
        else {
          piVar12 = __errno_location();
          if (*piVar12 == 0xc) {
            archive_set_error(&a->archive,0xc,"Can\'t allocate memory  for Symlink");
            return -0x1e;
          }
        }
      }
    }
    pcVar13 = archive_entry_pathname(*(archive_entry **)(e + 0x30));
    iVar6 = is_all_ascii(pcVar13);
    if (iVar6 == 0) {
      if (*(long *)(e + 0x118) == 0) {
        pcVar13 = nl_langinfo(0xe);
        iVar6 = strcmp(pcVar13,"UTF-8");
        if (iVar6 == 0) {
          *(uint *)(e + 0x44) = *(uint *)(e + 0x44) | 0x800;
        }
      }
      else {
        pcVar13 = archive_string_conversion_charset_name(*(archive_string_conv **)(e + 0x118));
        iVar6 = strcmp(pcVar13,"UTF-8");
        if (iVar6 == 0) {
          *(uint *)(e + 0x44) = *(uint *)(e + 0x44) | 0x800;
        }
      }
    }
    slink = (char *)path_length(*(archive_entry **)(e + 0x30));
    if (p._4_4_ == 0xa000) {
      slink_size = (size_t)archive_entry_symlink(*(archive_entry **)(e + 0x30));
      if ((char *)slink_size == (char *)0x0) {
        sconv = (archive_string_conv *)0x0;
      }
      else {
        sconv = (archive_string_conv *)strlen((char *)slink_size);
      }
      *(archive_string_conv **)(e + 0x28) = sconv;
      *(archive_string_conv **)(e + 8) = sconv;
      *(archive_string_conv **)(e + 0x10) = sconv;
      uVar5 = (**(code **)(e + 0xe8))(*(undefined4 *)(e + 0x38),slink_size,sconv);
      *(undefined4 *)(e + 0x38) = uVar5;
      e[0x3c] = '\0';
      e[0x3d] = '\0';
      e[0x3e] = '\0';
      e[0x3f] = '\0';
      p._0_4_ = 0x14;
    }
    else if (p._4_4_ == 0x8000) {
      wVar4 = archive_entry_size_is_set(*(archive_entry **)(e + 0x30));
      if (wVar4 == L'\0') {
        e[0x3c] = '\b';
        e[0x3d] = '\0';
        e[0x3e] = '\0';
        e[0x3f] = '\0';
        *(uint *)(e + 0x44) = *(uint *)(e + 0x44) | 8;
        if ((*(uint *)(e + 0x138) & 1) == 0) {
          e[0x48] = '\x01';
          e[0x49] = '\0';
          e[0x4a] = '\0';
          e[0x4b] = '\0';
          p._0_4_ = 0x2d;
        }
        else if (*(int *)(e + 0x3c) == 0) {
          p._0_4_ = 10;
        }
        else {
          p._0_4_ = 0x14;
        }
        if ((((*(uint *)(e + 0x44) & 1) != 0) && (*(int *)(e + 0x40) - 1U < 3)) && ((uint)p < 0x14))
        {
          p._0_4_ = 0x14;
        }
      }
      else {
        lVar10 = archive_entry_size(*(archive_entry **)(e + 0x30));
        zip64_start = (uchar *)0x0;
        *(la_int64_t *)(e + 0x28) = lVar10;
        *(undefined4 *)(e + 0x3c) = *(undefined4 *)(e + 0x128);
        if (*(int *)(e + 0x3c) == -1) {
          e[0x3c] = '\b';
          e[0x3d] = '\0';
          e[0x3e] = '\0';
          e[0x3f] = '\0';
        }
        if (*(int *)(e + 0x3c) == 0) {
          *(la_int64_t *)(e + 8) = lVar10;
          *(la_int64_t *)(e + 0x10) = lVar10;
          p._0_4_ = 10;
        }
        else {
          *(la_int64_t *)(e + 0x10) = lVar10;
          p._0_4_ = 0x14;
        }
        if ((*(uint *)(e + 0x44) & 1) != 0) {
          iVar6 = *(int *)(e + 0x40);
          if (iVar6 == 1) {
            zip64_start = (uchar *)0xc;
            p._0_4_ = 0x14;
          }
          else if (iVar6 == 2) {
            zip64_start = (uchar *)0x14;
            p._0_4_ = 0x14;
          }
          else if (iVar6 == 3) {
            zip64_start = (uchar *)0x1c;
            p._0_4_ = 0x14;
          }
          if (*(int *)(e + 0x3c) == 0) {
            *(uchar **)(e + 8) = zip64_start + *(long *)(e + 8);
          }
        }
        if ((((*(uint *)(e + 0x138) & 2) != 0) ||
            (0xffffffff < (long)(zip64_start + *(long *)(e + 0x10)))) ||
           ((0xff000000 < *(long *)(e + 0x10) && (*(int *)(e + 0x3c) != 0)))) {
          e[0x48] = '\x01';
          e[0x49] = '\0';
          e[0x4a] = '\0';
          e[0x4b] = '\0';
          p._0_4_ = 0x2d;
        }
        *(uint *)(e + 0x44) = *(uint *)(e + 0x44) | 8;
      }
    }
    else {
      e[0x3c] = '\0';
      e[0x3d] = '\0';
      e[0x3e] = '\0';
      e[0x3f] = '\0';
      e[0x28] = '\0';
      e[0x29] = '\0';
      e[0x2a] = '\0';
      e[0x2b] = '\0';
      e[0x2c] = '\0';
      e[0x2d] = '\0';
      e[0x2e] = '\0';
      e[0x2f] = '\0';
      p._0_4_ = 0x14;
    }
    memset(local_extra + 0x88,0,0x20);
    builtin_memcpy(local_extra + 0x88,"PK\x03\x04",4);
    archive_le16enc(local_extra + 0x8c,(uint16_t)(uint)p);
    archive_le16enc(local_extra + 0x8e,(uint16_t)*(undefined4 *)(e + 0x44));
    if ((*(int *)(e + 0x40) == 2) || (*(int *)(e + 0x40) == 3)) {
      archive_le16enc(local_header,99);
    }
    else {
      archive_le16enc(local_header,(uint16_t)*(undefined4 *)(e + 0x3c));
    }
    tVar15 = archive_entry_mtime(*(archive_entry **)(e + 0x30));
    uVar7 = dos_time(tVar15);
    archive_le32enc(local_header + 2,uVar7);
    archive_le32enc(local_header + 6,*(uint32_t *)(e + 0x38));
    if (*(int *)(e + 0x48) == 0) {
      archive_le32enc(local_header + 10,(uint32_t)*(undefined8 *)(e + 8));
      archive_le32enc(local_header + 0xe,(uint32_t)*(undefined8 *)(e + 0x10));
    }
    else {
      archive_le32enc(local_header + 10,0xffffffff);
      archive_le32enc(local_header + 0xe,0xffffffff);
    }
    archive_le16enc(local_header + 0x12,(uint16_t)slink);
    if (*(int *)(e + 0x40) == 1) {
      if ((*(uint *)(e + 0x44) & 8) == 0) {
        e[0x5d] = local_header[9];
      }
      else {
        e[0x5d] = local_header[3];
      }
    }
    puVar16 = cd_alloc((zip_conflict *)e,0x2e);
    *(uchar **)(e + 0xd8) = puVar16;
    *(long *)(e + 0x108) = *(long *)(e + 0x108) + 1;
    memset(*(void **)(e + 0xd8),0,0x2e);
    **(undefined4 **)(e + 0xd8) = 0x2014b50;
    archive_le16enc((void *)(*(long *)(e + 0xd8) + 4),(short)(uint)p + 0x300);
    archive_le16enc((void *)(*(long *)(e + 0xd8) + 6),(uint16_t)(uint)p);
    archive_le16enc((void *)(*(long *)(e + 0xd8) + 8),(uint16_t)*(undefined4 *)(e + 0x44));
    if ((*(int *)(e + 0x40) == 2) || (*(int *)(e + 0x40) == 3)) {
      archive_le16enc((void *)(*(long *)(e + 0xd8) + 10),99);
    }
    else {
      archive_le16enc((void *)(*(long *)(e + 0xd8) + 10),(uint16_t)*(undefined4 *)(e + 0x3c));
    }
    lVar1 = *(long *)(e + 0xd8);
    tVar15 = archive_entry_mtime(*(archive_entry **)(e + 0x30));
    uVar7 = dos_time(tVar15);
    archive_le32enc((void *)(lVar1 + 0xc),uVar7);
    archive_le16enc((void *)(*(long *)(e + 0xd8) + 0x1c),(uint16_t)slink);
    lVar1 = *(long *)(e + 0xd8);
    mVar8 = archive_entry_mode(*(archive_entry **)(e + 0x30));
    archive_le32enc((void *)(lVar1 + 0x26),mVar8 << 0x10);
    cd_extra = cd_alloc((zip_conflict *)e,(size_t)slink);
    copy_path(*(archive_entry **)(e + 0x30),cd_extra);
    memset(&zip,0,0x90);
    cd_extra = (uchar *)&zip;
    zip._0_2_ = 0x5455;
    wVar4 = archive_entry_mtime_is_set(entry);
    sVar3 = 0;
    if (wVar4 != L'\0') {
      sVar3 = 4;
    }
    wVar4 = archive_entry_atime_is_set(entry);
    sVar19 = 0;
    if (wVar4 != L'\0') {
      sVar19 = 4;
    }
    wVar4 = archive_entry_ctime_is_set(entry);
    sVar20 = 0;
    if (wVar4 != L'\0') {
      sVar20 = 4;
    }
    archive_le16enc((void *)((long)&zip + 2),sVar3 + 1 + sVar19 + sVar20);
    cd_extra = cd_extra + 4;
    wVar4 = archive_entry_mtime_is_set(entry);
    wVar9 = archive_entry_atime_is_set(entry);
    bVar17 = 0;
    if (wVar9 != L'\0') {
      bVar17 = 2;
    }
    wVar9 = archive_entry_ctime_is_set(entry);
    bVar18 = 0;
    if (wVar9 != L'\0') {
      bVar18 = 4;
    }
    puVar16 = cd_extra + 1;
    *cd_extra = wVar4 != L'\0' | bVar17 | bVar18;
    cd_extra = puVar16;
    wVar4 = archive_entry_mtime_is_set(entry);
    puVar16 = cd_extra;
    if (wVar4 != L'\0') {
      tVar15 = archive_entry_mtime(entry);
      archive_le32enc(puVar16,(uint32_t)tVar15);
      cd_extra = cd_extra + 4;
    }
    wVar4 = archive_entry_atime_is_set(entry);
    puVar16 = cd_extra;
    if (wVar4 != L'\0') {
      tVar15 = archive_entry_atime(entry);
      archive_le32enc(puVar16,(uint32_t)tVar15);
      cd_extra = cd_extra + 4;
    }
    wVar4 = archive_entry_ctime_is_set(entry);
    puVar16 = cd_extra;
    if (wVar4 != L'\0') {
      tVar15 = archive_entry_ctime(entry);
      archive_le32enc(puVar16,(uint32_t)tVar15);
      cd_extra = cd_extra + 4;
    }
    builtin_memcpy(cd_extra,"ux\v",4);
    cd_extra[4] = '\x01';
    puVar16 = cd_extra + 6;
    cd_extra[5] = '\x04';
    cd_extra = puVar16;
    lVar10 = archive_entry_uid(entry);
    archive_le32enc(puVar16,(uint32_t)lVar10);
    puVar16 = cd_extra + 5;
    cd_extra[4] = '\x04';
    cd_extra = puVar16;
    lVar10 = archive_entry_gid(entry);
    archive_le32enc(puVar16,(uint32_t)lVar10);
    cd_extra = cd_extra + 4;
    if (((*(uint *)(e + 0x44) & 1) != 0) && ((*(int *)(e + 0x40) == 2 || (*(int *)(e + 0x40) == 3)))
       ) {
      cd_extra[0] = '\x01';
      cd_extra[1] = -0x67;
      cd_extra[2] = '\a';
      cd_extra[3] = '\0';
      cd_extra[4] = '\x01';
      cd_extra[5] = '\0';
      cd_extra[6] = 'A';
      cd_extra[7] = 'E';
      wVar4 = archive_entry_size_is_set(*(archive_entry **)(e + 0x30));
      if ((wVar4 == L'\0') ||
         (lVar10 = archive_entry_size(*(archive_entry **)(e + 0x30)), 0x13 < lVar10)) {
        e[0x60] = '\x01';
        e[0x61] = '\0';
        e[0x62] = '\0';
        e[99] = '\0';
      }
      else {
        archive_le16enc(cd_extra + 4,2);
        e[0x60] = '\x02';
        e[0x61] = '\0';
        e[0x62] = '\0';
        e[99] = '\0';
      }
      puVar16 = cd_extra + 8;
      uVar2 = '\x03';
      if (*(int *)(e + 0x40) == 2) {
        uVar2 = '\x01';
      }
      cd_extra = cd_extra + 9;
      *puVar16 = uVar2;
      archive_le16enc(cd_extra,(uint16_t)*(undefined4 *)(e + 0x3c));
      cd_extra = cd_extra + 2;
    }
    *(undefined8 *)(e + 0xe0) = *(undefined8 *)(e + 0x100);
    filename_length = (size_t)cd_alloc((zip_conflict *)e,(long)cd_extra - (long)&zip);
    memcpy((void *)filename_length,&zip,(long)cd_extra - (long)&zip);
    puVar16 = cd_extra;
    if (*(int *)(e + 0x48) != 0) {
      cd_extra[0] = '\x01';
      cd_extra[1] = '\0';
      cd_extra[2] = '\x10';
      cd_extra[3] = '\0';
      cd_extra = cd_extra + 4;
      archive_le64enc(cd_extra,*(uint64_t *)(e + 0x10));
      cd_extra = cd_extra + 8;
      archive_le64enc(cd_extra,*(uint64_t *)(e + 8));
      cd_extra = cd_extra + 8;
      archive_le16enc(puVar16 + 2,(short)cd_extra - ((short)puVar16 + 4));
    }
    puVar16 = cd_extra;
    if ((*(uint *)(e + 0x138) & 4) != 0) {
      cd_extra[0] = 'x';
      cd_extra[1] = 'l';
      cd_extra[2] = '\0';
      cd_extra[3] = '\0';
      cd_extra[4] = '\a';
      cd_extra = cd_extra + 5;
      archive_le16enc(cd_extra,(short)(uint)p + 0x300);
      cd_extra = cd_extra + 2;
      archive_le16enc(cd_extra,0);
      pp = cd_extra + 2;
      cd_extra = pp;
      mVar8 = archive_entry_mode(*(archive_entry **)(e + 0x30));
      archive_le32enc(pp,mVar8 << 0x10);
      cd_extra = cd_extra + 4;
      archive_le16enc(puVar16 + 2,(short)cd_extra - ((short)puVar16 + 4));
    }
    archive_le16enc(local_header + 0x14,(short)cd_extra - (short)&zip);
    type = __archive_write_output(a,local_extra + 0x88,0x1e);
    if (type == 0) {
      *(long *)(e + 0x110) = *(long *)(e + 0x110) + 0x1e;
      type = write_path(*(archive_entry **)(e + 0x30),a);
      if ((int)type < 1) {
        a_local._4_4_ = -0x1e;
      }
      else {
        *(long *)(e + 0x110) = (long)(int)type + *(long *)(e + 0x110);
        type = __archive_write_output(a,&zip,(long)cd_extra - (long)&zip);
        if (type == 0) {
          *(uchar **)(e + 0x110) = cd_extra + (*(long *)(e + 0x110) - (long)&zip);
          if (slink_size != 0) {
            iVar6 = __archive_write_output(a,(void *)slink_size,(size_t)sconv);
            if (iVar6 != 0) {
              return -0x1e;
            }
            *(long *)(e + 0x18) = (long)sconv->converter + *(long *)(e + 0x18) + -0x40;
            *(long *)(e + 0x20) = (long)sconv->converter + *(long *)(e + 0x20) + -0x40;
            *(long *)(e + 0x110) = (long)sconv->converter + *(long *)(e + 0x110) + -0x40;
          }
          type = 0;
          if (*(int *)(e + 0x3c) == 8) {
            e[0x180] = '\0';
            e[0x181] = '\0';
            e[0x182] = '\0';
            e[0x183] = '\0';
            e[0x184] = '\0';
            e[0x185] = '\0';
            e[0x186] = '\0';
            e[0x187] = '\0';
            e[0x188] = '\0';
            e[0x189] = '\0';
            e[0x18a] = '\0';
            e[0x18b] = '\0';
            e[0x18c] = '\0';
            e[0x18d] = '\0';
            e[0x18e] = '\0';
            e[399] = '\0';
            e[400] = '\0';
            e[0x191] = '\0';
            e[0x192] = '\0';
            e[0x193] = '\0';
            e[0x194] = '\0';
            e[0x195] = '\0';
            e[0x196] = '\0';
            e[0x197] = '\0';
            *(undefined8 *)(e + 0x158) = *(undefined8 *)(e + 0x1b8);
            *(int *)(e + 0x160) = (int)*(undefined8 *)(e + 0x1b0);
            iVar6 = cm_zlib_deflateInit2_
                              ((z_streamp)(e + 0x140),*(int *)(e + 300),8,-0xf,8,0,"1.2.3",0x70);
            if (iVar6 != 0) {
              archive_set_error(&a->archive,0xc,"Can\'t init deflate compressor");
              return -0x1e;
            }
          }
          a_local._4_4_ = version_needed;
        }
        else {
          a_local._4_4_ = -0x1e;
        }
      }
    }
    else {
      a_local._4_4_ = -0x1e;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_write_zip_header(struct archive_write *a, struct archive_entry *entry)
{
	unsigned char local_header[32];
	unsigned char local_extra[144];
	struct zip *zip = a->format_data;
	unsigned char *e;
	unsigned char *cd_extra;
	size_t filename_length;
	const char *slink = NULL;
	size_t slink_size = 0;
	struct archive_string_conv *sconv = get_sconv(a, zip);
	int ret, ret2 = ARCHIVE_OK;
	mode_t type;
	int version_needed = 10;

	/* Ignore types of entries that we don't support. */
	type = archive_entry_filetype(entry);
	if (type != AE_IFREG && type != AE_IFDIR && type != AE_IFLNK) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Filetype not supported");
		return ARCHIVE_FAILED;
	};

	/* If we're not using Zip64, reject large files. */
	if (zip->flags & ZIP_FLAG_AVOID_ZIP64) {
		/* Reject entries over 4GB. */
		if (archive_entry_size_is_set(entry)
		    && (archive_entry_size(entry) > ZIP_4GB_MAX)) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Files > 4GB require Zip64 extensions");
			return ARCHIVE_FAILED;
		}
		/* Reject entries if archive is > 4GB. */
		if (zip->written_bytes > ZIP_4GB_MAX) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Archives > 4GB require Zip64 extensions");
			return ARCHIVE_FAILED;
		}
	}

	/* Only regular files can have size > 0. */
	if (type != AE_IFREG)
		archive_entry_set_size(entry, 0);


	/* Reset information from last entry. */
	zip->entry_offset = zip->written_bytes;
	zip->entry_uncompressed_limit = INT64_MAX;
	zip->entry_compressed_size = 0;
	zip->entry_uncompressed_size = 0;
	zip->entry_compressed_written = 0;
	zip->entry_uncompressed_written = 0;
	zip->entry_flags = 0;
	zip->entry_uses_zip64 = 0;
	zip->entry_crc32 = zip->crc32func(0, NULL, 0);
	zip->entry_encryption = 0;
	if (zip->entry != NULL) {
		archive_entry_free(zip->entry);
		zip->entry = NULL;
	}

	if (zip->cctx_valid)
		archive_encrypto_aes_ctr_release(&zip->cctx);
	if (zip->hctx_valid)
		archive_hmac_sha1_cleanup(&zip->hctx);
	zip->tctx_valid = zip->cctx_valid = zip->hctx_valid = 0;

	if (type == AE_IFREG
		    &&(!archive_entry_size_is_set(entry)
			|| archive_entry_size(entry) > 0)) {
		switch (zip->encryption_type) {
		case ENCRYPTION_TRADITIONAL:
		case ENCRYPTION_WINZIP_AES128:
		case ENCRYPTION_WINZIP_AES256:
			zip->entry_flags |= ZIP_ENTRY_FLAG_ENCRYPTED;
			zip->entry_encryption = zip->encryption_type;
			break;
		default:
			break;
		}
	}


#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pathname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	zip->entry = __la_win_entry_in_posix_pathseparator(entry);
	if (zip->entry == entry)
		zip->entry = archive_entry_clone(entry);
#else
	zip->entry = archive_entry_clone(entry);
#endif
	if (zip->entry == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate zip header data");
		return (ARCHIVE_FATAL);
	}

	if (sconv != NULL) {
		const char *p;
		size_t len;

		if (archive_entry_pathname_l(entry, &p, &len, sconv) != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Pathname");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Can't translate Pathname '%s' to %s",
			    archive_entry_pathname(entry),
			    archive_string_conversion_charset_name(sconv));
			ret2 = ARCHIVE_WARN;
		}
		if (len > 0)
			archive_entry_set_pathname(zip->entry, p);

		/*
		 * There is no standard for symlink handling; we convert
		 * it using the same character-set translation that we use
		 * for filename.
		 */
		if (type == AE_IFLNK) {
			if (archive_entry_symlink_l(entry, &p, &len, sconv)) {
				if (errno == ENOMEM) {
					archive_set_error(&a->archive, ENOMEM,
					    "Can't allocate memory "
					    " for Symlink");
					return (ARCHIVE_FATAL);
				}
				/* No error if we can't convert. */
			} else if (len > 0)
				archive_entry_set_symlink(zip->entry, p);
		}
	}

	/* If filename isn't ASCII and we can use UTF-8, set the UTF-8 flag. */
	if (!is_all_ascii(archive_entry_pathname(zip->entry))) {
		if (zip->opt_sconv != NULL) {
			if (strcmp(archive_string_conversion_charset_name(
					zip->opt_sconv), "UTF-8") == 0)
				zip->entry_flags |= ZIP_ENTRY_FLAG_UTF8_NAME;
#if HAVE_NL_LANGINFO
		} else if (strcmp(nl_langinfo(CODESET), "UTF-8") == 0) {
			zip->entry_flags |= ZIP_ENTRY_FLAG_UTF8_NAME;
#endif
		}
	}
	filename_length = path_length(zip->entry);

	/* Determine appropriate compression and size for this entry. */
	if (type == AE_IFLNK) {
		slink = archive_entry_symlink(zip->entry);
		if (slink != NULL)
			slink_size = strlen(slink);
		else
			slink_size = 0;
		zip->entry_uncompressed_limit = slink_size;
		zip->entry_compressed_size = slink_size;
		zip->entry_uncompressed_size = slink_size;
		zip->entry_crc32 = zip->crc32func(zip->entry_crc32,
		    (const unsigned char *)slink, slink_size);
		zip->entry_compression = COMPRESSION_STORE;
		version_needed = 20;
	} else if (type != AE_IFREG) {
		zip->entry_compression = COMPRESSION_STORE;
		zip->entry_uncompressed_limit = 0;
		version_needed = 20;
	} else if (archive_entry_size_is_set(zip->entry)) {
		int64_t size = archive_entry_size(zip->entry);
		int64_t additional_size = 0;

		zip->entry_uncompressed_limit = size;
		zip->entry_compression = zip->requested_compression;
		if (zip->entry_compression == COMPRESSION_UNSPECIFIED) {
			zip->entry_compression = COMPRESSION_DEFAULT;
		}
		if (zip->entry_compression == COMPRESSION_STORE) {
			zip->entry_compressed_size = size;
			zip->entry_uncompressed_size = size;
			version_needed = 10;
		} else {
			zip->entry_uncompressed_size = size;
			version_needed = 20;
		}

		if (zip->entry_flags & ZIP_ENTRY_FLAG_ENCRYPTED) {
			switch (zip->entry_encryption) {
			case ENCRYPTION_TRADITIONAL:
				additional_size = TRAD_HEADER_SIZE;
				version_needed = 20;
				break;
			case ENCRYPTION_WINZIP_AES128:
				additional_size = WINZIP_AES128_HEADER_SIZE
				    + AUTH_CODE_SIZE;
				version_needed = 20;
				break;
			case ENCRYPTION_WINZIP_AES256:
				additional_size = WINZIP_AES256_HEADER_SIZE
				    + AUTH_CODE_SIZE;
				version_needed = 20;
				break;
			default:
				break;
			}
			if (zip->entry_compression == COMPRESSION_STORE)
				zip->entry_compressed_size += additional_size;
		}

		/*
		 * Set Zip64 extension in any of the following cases
		 * (this was suggested by discussion on info-zip-dev
		 * mailing list):
		 *  = Zip64 is being forced by user
		 *  = File is over 4GiB uncompressed
		 *    (including encryption header, if any)
		 *  = File is close to 4GiB and is being compressed
		 *    (compression might make file larger)
		 */
		if ((zip->flags & ZIP_FLAG_FORCE_ZIP64)
		    || (zip->entry_uncompressed_size + additional_size > ZIP_4GB_MAX)
		    || (zip->entry_uncompressed_size > ZIP_4GB_MAX_UNCOMPRESSED
			&& zip->entry_compression != COMPRESSION_STORE)) {
			zip->entry_uses_zip64 = 1;
			version_needed = 45;
		}

		/* We may know the size, but never the CRC. */
		zip->entry_flags |= ZIP_ENTRY_FLAG_LENGTH_AT_END;
	} else {
		/* We don't know the size.  In this case, we prefer
		 * deflate (it has a clear end-of-data marker which
		 * makes length-at-end more reliable) and will
		 * enable Zip64 extensions unless we're told not to.
		 */
		zip->entry_compression = COMPRESSION_DEFAULT;
		zip->entry_flags |= ZIP_ENTRY_FLAG_LENGTH_AT_END;
		if ((zip->flags & ZIP_FLAG_AVOID_ZIP64) == 0) {
			zip->entry_uses_zip64 = 1;
			version_needed = 45;
		} else if (zip->entry_compression == COMPRESSION_STORE) {
			version_needed = 10;
		} else {
			version_needed = 20;
		}

		if (zip->entry_flags & ZIP_ENTRY_FLAG_ENCRYPTED) {
			switch (zip->entry_encryption) {
			case ENCRYPTION_TRADITIONAL:
			case ENCRYPTION_WINZIP_AES128:
			case ENCRYPTION_WINZIP_AES256:
				if (version_needed < 20)
					version_needed = 20;
				break;
			default:
				break;
			}
		}
	}

	/* Format the local header. */
	memset(local_header, 0, sizeof(local_header));
	memcpy(local_header, "PK\003\004", 4);
	archive_le16enc(local_header + 4, version_needed);
	archive_le16enc(local_header + 6, zip->entry_flags);
	if (zip->entry_encryption == ENCRYPTION_WINZIP_AES128
	    || zip->entry_encryption == ENCRYPTION_WINZIP_AES256)
		archive_le16enc(local_header + 8, WINZIP_AES_ENCRYPTION);
	else
		archive_le16enc(local_header + 8, zip->entry_compression);
	archive_le32enc(local_header + 10,
		dos_time(archive_entry_mtime(zip->entry)));
	archive_le32enc(local_header + 14, zip->entry_crc32);
	if (zip->entry_uses_zip64) {
		/* Zip64 data in the local header "must" include both
		 * compressed and uncompressed sizes AND those fields
		 * are included only if these are 0xffffffff;
		 * THEREFORE these must be set this way, even if we
		 * know one of them is smaller. */
		archive_le32enc(local_header + 18, ZIP_4GB_MAX);
		archive_le32enc(local_header + 22, ZIP_4GB_MAX);
	} else {
		archive_le32enc(local_header + 18, (uint32_t)zip->entry_compressed_size);
		archive_le32enc(local_header + 22, (uint32_t)zip->entry_uncompressed_size);
	}
	archive_le16enc(local_header + 26, (uint16_t)filename_length);

	if (zip->entry_encryption == ENCRYPTION_TRADITIONAL) {
		if (zip->entry_flags & ZIP_ENTRY_FLAG_LENGTH_AT_END)
			zip->trad_chkdat = local_header[11];
		else
			zip->trad_chkdat = local_header[17];
	}

	/* Format as much of central directory file header as we can: */
	zip->file_header = cd_alloc(zip, 46);
	/* If (zip->file_header == NULL) XXXX */
	++zip->central_directory_entries;
	memset(zip->file_header, 0, 46);
	memcpy(zip->file_header, "PK\001\002", 4);
	/* "Made by PKZip 2.0 on Unix." */
	archive_le16enc(zip->file_header + 4, 3 * 256 + version_needed);
	archive_le16enc(zip->file_header + 6, version_needed);
	archive_le16enc(zip->file_header + 8, zip->entry_flags);
	if (zip->entry_encryption == ENCRYPTION_WINZIP_AES128
	    || zip->entry_encryption == ENCRYPTION_WINZIP_AES256)
		archive_le16enc(zip->file_header + 10, WINZIP_AES_ENCRYPTION);
	else
		archive_le16enc(zip->file_header + 10, zip->entry_compression);
	archive_le32enc(zip->file_header + 12,
		dos_time(archive_entry_mtime(zip->entry)));
	archive_le16enc(zip->file_header + 28, (uint16_t)filename_length);
	/* Following Info-Zip, store mode in the "external attributes" field. */
	archive_le32enc(zip->file_header + 38,
	    ((uint32_t)archive_entry_mode(zip->entry)) << 16);
	e = cd_alloc(zip, filename_length);
	/* If (e == NULL) XXXX */
	copy_path(zip->entry, e);

	/* Format extra data. */
	memset(local_extra, 0, sizeof(local_extra));
	e = local_extra;

	/* First, extra blocks that are the same between
	 * the local file header and the central directory.
	 * We format them once and then duplicate them. */

	/* UT timestamp, length depends on what timestamps are set. */
	memcpy(e, "UT", 2);
	archive_le16enc(e + 2,
	    1
	    + (archive_entry_mtime_is_set(entry) ? 4 : 0)
	    + (archive_entry_atime_is_set(entry) ? 4 : 0)
	    + (archive_entry_ctime_is_set(entry) ? 4 : 0));
	e += 4;
	*e++ =
	    (archive_entry_mtime_is_set(entry) ? 1 : 0)
	    | (archive_entry_atime_is_set(entry) ? 2 : 0)
	    | (archive_entry_ctime_is_set(entry) ? 4 : 0);
	if (archive_entry_mtime_is_set(entry)) {
		archive_le32enc(e, (uint32_t)archive_entry_mtime(entry));
		e += 4;
	}
	if (archive_entry_atime_is_set(entry)) {
		archive_le32enc(e, (uint32_t)archive_entry_atime(entry));
		e += 4;
	}
	if (archive_entry_ctime_is_set(entry)) {
		archive_le32enc(e, (uint32_t)archive_entry_ctime(entry));
		e += 4;
	}

	/* ux Unix extra data, length 11, version 1 */
	/* TODO: If uid < 64k, use 2 bytes, ditto for gid. */
	memcpy(e, "ux\013\000\001", 5);
	e += 5;
	*e++ = 4; /* Length of following UID */
	archive_le32enc(e, (uint32_t)archive_entry_uid(entry));
	e += 4;
	*e++ = 4; /* Length of following GID */
	archive_le32enc(e, (uint32_t)archive_entry_gid(entry));
	e += 4;

	/* AES extra data field: WinZIP AES information, ID=0x9901 */
	if ((zip->entry_flags & ZIP_ENTRY_FLAG_ENCRYPTED)
	    && (zip->entry_encryption == ENCRYPTION_WINZIP_AES128
	        || zip->entry_encryption == ENCRYPTION_WINZIP_AES256)) {

		memcpy(e, "\001\231\007\000\001\000AE", 8);
		/* AES vendor version AE-2 does not store a CRC.
		 * WinZip 11 uses AE-1, which does store the CRC,
		 * but it does not store the CRC when the file size
		 * is less than 20 bytes. So we simulate what
		 * WinZip 11 does.
		 * NOTE: WinZip 9.0 and 10.0 uses AE-2 by default. */
		if (archive_entry_size_is_set(zip->entry)
		    && archive_entry_size(zip->entry) < 20) {
			archive_le16enc(e+4, AES_VENDOR_AE_2);
			zip->aes_vendor = AES_VENDOR_AE_2;/* no CRC. */
		} else
			zip->aes_vendor = AES_VENDOR_AE_1;
		e += 8;
		/* AES encryption strength. */
		*e++ = (zip->entry_encryption == ENCRYPTION_WINZIP_AES128)?1:3;
		/* Actual compression method. */
		archive_le16enc(e, zip->entry_compression);
		e += 2;
	}

	/* Copy UT ,ux, and AES-extra into central directory as well. */
	zip->file_header_extra_offset = zip->central_directory_bytes;
	cd_extra = cd_alloc(zip, e - local_extra);
	memcpy(cd_extra, local_extra, e - local_extra);

	/*
	 * Following extra blocks vary between local header and
	 * central directory. These are the local header versions.
	 * Central directory versions get formatted in
	 * archive_write_zip_finish_entry() below.
	 */

	/* "[Zip64 entry] in the local header MUST include BOTH
	 * original [uncompressed] and compressed size fields." */
	if (zip->entry_uses_zip64) {
		unsigned char *zip64_start = e;
		memcpy(e, "\001\000\020\000", 4);
		e += 4;
		archive_le64enc(e, zip->entry_uncompressed_size);
		e += 8;
		archive_le64enc(e, zip->entry_compressed_size);
		e += 8;
		archive_le16enc(zip64_start + 2, (uint16_t)(e - (zip64_start + 4)));
	}

	if (zip->flags & ZIP_FLAG_EXPERIMENT_xl) {
		/* Experimental 'xl' extension to improve streaming. */
		unsigned char *external_info = e;
		int included = 7;
		memcpy(e, "xl\000\000", 4); // 0x6c65 + 2-byte length
		e += 4;
		e[0] = included; /* bitmap of included fields */
		e += 1;
		if (included & 1) {
			archive_le16enc(e, /* "Version created by" */
			    3 * 256 + version_needed);
			e += 2;
		}
		if (included & 2) {
			archive_le16enc(e, 0); /* internal file attributes */
			e += 2;
		}
		if (included & 4) {
			archive_le32enc(e,  /* external file attributes */
			    ((uint32_t)archive_entry_mode(zip->entry)) << 16);
			e += 4;
		}
		if (included & 8) {
			// Libarchive does not currently support file comments.
		}
		archive_le16enc(external_info + 2, (uint16_t)(e - (external_info + 4)));
	}

	/* Update local header with size of extra data and write it all out: */
	archive_le16enc(local_header + 28, (uint16_t)(e - local_extra));

	ret = __archive_write_output(a, local_header, 30);
	if (ret != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	zip->written_bytes += 30;

	ret = write_path(zip->entry, a);
	if (ret <= ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	zip->written_bytes += ret;

	ret = __archive_write_output(a, local_extra, e - local_extra);
	if (ret != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	zip->written_bytes += e - local_extra;

	/* For symlinks, write the body now. */
	if (slink != NULL) {
		ret = __archive_write_output(a, slink, slink_size);
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		zip->entry_compressed_written += slink_size;
		zip->entry_uncompressed_written += slink_size;
		zip->written_bytes += slink_size;
	}

#ifdef HAVE_ZLIB_H
	if (zip->entry_compression == COMPRESSION_DEFLATE) {
		zip->stream.zalloc = Z_NULL;
		zip->stream.zfree = Z_NULL;
		zip->stream.opaque = Z_NULL;
		zip->stream.next_out = zip->buf;
		zip->stream.avail_out = (uInt)zip->len_buf;
		if (deflateInit2(&zip->stream, zip->deflate_compression_level,
		    Z_DEFLATED, -15, 8, Z_DEFAULT_STRATEGY) != Z_OK) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't init deflate compressor");
			return (ARCHIVE_FATAL);
		}
	}
#endif

	return (ret2);
}